

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::generate_reflection_setters
          (t_java_generator *this,ostringstream *out,t_type *type,string *field_name,
          string *cap_name)

{
  int *piVar1;
  pointer pcVar2;
  string *psVar3;
  int iVar4;
  ostream *poVar5;
  t_java_generator *this_00;
  string local_a0;
  string *local_80;
  t_type *local_78;
  string local_70;
  string local_50;
  
  local_80 = cap_name;
  local_78 = type;
  iVar4 = (*(type->super_t_doc)._vptr_t_doc[7])(type);
  poVar5 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"case ",5);
  this_00 = (t_java_generator *)(field_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,this_00,
             (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator._vptr_t_generator +
                      field_name->_M_string_length));
  constant_name(&local_a0,this_00,&local_50);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (value == null) {",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  unset",7);
  pcVar2 = (field_name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + field_name->_M_string_length);
  get_cap_name(&local_a0,this,&local_70);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"();",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  poVar5 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} else {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  psVar3 = local_80;
  if ((char)iVar4 != '\0') {
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar5 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (value instanceof byte[]) {",0x1e)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  set",5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"((byte[])value);",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} else {",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar5 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  set",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"((",2);
  type_name_abi_cxx11_(&local_a0,this,local_78,true,false,false,false);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")value);",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((char)iVar4 != '\0') {
    poVar5 = t_generator::indent((t_generator *)this,
                                 &out->super_basic_ostream<char,_std::char_traits<char>_>);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
  }
  poVar5 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,
                               &out->super_basic_ostream<char,_std::char_traits<char>_>);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"break;",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void t_java_generator::generate_reflection_setters(ostringstream& out,
                                                   t_type* type,
                                                   string field_name,
                                                   string cap_name) {
  const bool is_binary = type->is_binary();
  indent(out) << "case " << constant_name(field_name) << ":" << endl;
  indent_up();
  indent(out) << "if (value == null) {" << endl;
  indent(out) << "  unset" << get_cap_name(field_name) << "();" << endl;
  indent(out) << "} else {" << endl;
  if (is_binary) {
    indent_up();
    indent(out) << "if (value instanceof byte[]) {" << endl;
    indent(out) << "  set" << cap_name << "((byte[])value);" << endl;
    indent(out) << "} else {" << endl;
  }
  indent(out) << "  set" << cap_name << "((" << type_name(type, true, false) << ")value);" << endl;
  if (is_binary) {
    indent(out) << "}" << endl;
    indent_down();
  }
  indent(out) << "}" << endl;
  indent(out) << "break;" << endl << endl;

  indent_down();
}